

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalNinjaGenerator::FindMakeProgram(cmGlobalNinjaGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  char *__s;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string error;
  string local_108;
  string local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  bVar3 = cmGlobalGenerator::FindMakeProgram((cmGlobalGenerator *)this,mf);
  if (bVar3) {
    paVar1 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"CMAKE_MAKE_PROGRAM","");
    __s = cmMakefile::GetDefinition(mf,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                               local_108.field_2._M_local_buf[0]) + 1);
    }
    if (__s != (char *)0x0) {
      pcVar2 = (char *)(this->NinjaCommand)._M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&this->NinjaCommand,0,pcVar2,(ulong)__s);
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_a8,&this->NinjaCommand);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[10]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                 (char (*) [10])"--version");
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_108._M_dataplus._M_p = (pointer)paVar1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      bVar3 = cmSystemTools::RunSingleCommand
                        (&local_a8,&local_108,&local_70,(int *)0x0,(char *)0x0,OUTPUT_NONE,
                         (cmDuration)0x0,Auto);
      if (bVar3) {
        cmSystemTools::TrimWhitespace(&local_e8,&local_108);
        std::__cxx11::string::operator=((string *)&this->NinjaVersion,(string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        CheckNinjaFeatures(this);
      }
      else {
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_50,&local_a8,"\' \'");
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x52c1a5);
        local_c8 = &local_b8;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_b8 = *plVar5;
          lStack_b0 = plVar4[3];
        }
        else {
          local_b8 = *plVar5;
          local_c8 = (long *)*plVar4;
        }
        local_c0 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_80 = *plVar5;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar5;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_e8.field_2._M_allocated_capacity = *psVar6;
          local_e8.field_2._8_8_ = plVar4[3];
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        }
        else {
          local_e8.field_2._M_allocated_capacity = *psVar6;
          local_e8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_e8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        cmMakefile::IssueMessage(mf,FATAL_ERROR,&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        cmSystemTools::s_FatalErrorOccured = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_a8);
      if (!bVar3) goto LAB_0026390d;
    }
    bVar3 = true;
  }
  else {
LAB_0026390d:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmGlobalNinjaGenerator::FindMakeProgram(cmMakefile* mf)
{
  if (!this->cmGlobalGenerator::FindMakeProgram(mf)) {
    return false;
  }
  if (const char* ninjaCommand = mf->GetDefinition("CMAKE_MAKE_PROGRAM")) {
    this->NinjaCommand = ninjaCommand;
    std::vector<std::string> command;
    command.push_back(this->NinjaCommand);
    command.emplace_back("--version");
    std::string version;
    std::string error;
    if (!cmSystemTools::RunSingleCommand(command, &version, &error, nullptr,
                                         nullptr,
                                         cmSystemTools::OUTPUT_NONE)) {
      mf->IssueMessage(MessageType::FATAL_ERROR,
                       "Running\n '" + cmJoin(command, "' '") +
                         "'\n"
                         "failed with:\n " +
                         error);
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
    this->NinjaVersion = cmSystemTools::TrimWhitespace(version);
    this->CheckNinjaFeatures();
  }
  return true;
}